

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinystr.cpp
# Opt level: O3

TiXmlString * __thiscall
despot::util::tinyxml::TiXmlString::append(TiXmlString *this,char *str,size_type len)

{
  ulong uVar1;
  Rep *pRVar2;
  size_type sVar3;
  
  pRVar2 = this->rep_;
  sVar3 = pRVar2->size;
  uVar1 = sVar3 + len;
  if (pRVar2->capacity < uVar1) {
    reserve(this,pRVar2->capacity + uVar1);
    pRVar2 = this->rep_;
    sVar3 = pRVar2->size;
  }
  memmove(pRVar2->str + sVar3,str,len);
  pRVar2 = this->rep_;
  pRVar2->size = uVar1;
  pRVar2->str[uVar1] = '\0';
  return this;
}

Assistant:

TiXmlString& TiXmlString::append(const char* str, size_type len) {
	size_type newsize = length() + len;
	if (newsize > capacity()) {
		reserve(newsize + capacity());
	}
	memmove(finish(), str, len);
	set_size(newsize);
	return *this;
}